

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_manager.cpp
# Opt level: O1

void __thiscall
miniros::ServiceManager::removeServiceServerLink(ServiceManager *this,ServiceServerLinkPtr *client)

{
  int iVar1;
  iterator __position;
  list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
  *this_00;
  
  if (this->shutting_down_ != false) {
    return;
  }
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->shutting_down_mutex_);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  if (this->shutting_down_ == false) {
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->service_server_links_mutex_);
    if (iVar1 != 0) {
      std::__throw_system_error(iVar1);
    }
    __position._M_node =
         (this->service_server_links_).
         super__List_base<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    this_00 = &this->service_server_links_;
    if (__position._M_node != (_List_node_base *)this_00) {
      do {
        if ((element_type *)__position._M_node[1]._M_next ==
            (client->super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr) break;
        __position._M_node = (__position._M_node)->_M_next;
      } while (__position._M_node != (_List_node_base *)this_00);
    }
    if (__position._M_node != (_List_node_base *)this_00) {
      std::__cxx11::
      list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
      ::_M_erase(this_00,__position);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->service_server_links_mutex_);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->shutting_down_mutex_);
  return;
}

Assistant:

void ServiceManager::removeServiceServerLink(const ServiceServerLinkPtr& client)
{
  // Guard against this getting called as a result of shutdown() dropping all connections (where shutting_down_mutex_ is already locked)
  if (shutting_down_)
  {
    return;
  }

  std::scoped_lock<std::recursive_mutex> shutdown_lock(shutting_down_mutex_);
  // Now check again, since the state may have changed between pre-lock/now
  if (shutting_down_)
  {
    return;
  }

  std::scoped_lock<std::mutex> lock(service_server_links_mutex_);

  auto it = std::find(service_server_links_.begin(), service_server_links_.end(), client);
  if (it != service_server_links_.end())
  {
    service_server_links_.erase(it);
  }
}